

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int Cudd_ClassifySupport
              (DdManager *dd,DdNode *f,DdNode *g,DdNode **common,DdNode **onlyF,DdNode **onlyG)

{
  int *piVar1;
  bool bVar2;
  uint index;
  int *piVar3;
  int *support;
  DdNode *pDVar4;
  DdNode *pDVar5;
  ulong uVar6;
  uint uVar7;
  DdNode **ppDVar8;
  
  uVar7 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar7 = dd->sizeZ;
  }
  piVar3 = (int *)malloc((long)(int)uVar7 << 2);
  if (piVar3 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    support = (int *)malloc((long)(int)uVar7 << 2);
    if (support != (int *)0x0) {
      uVar6 = (ulong)uVar7;
      if (0 < (int)uVar7) {
        memset(piVar3,0,uVar6 * 4);
        memset(support,0,uVar6 * 4);
      }
      ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),piVar3);
      ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
      ddSupportStep((DdNode *)((ulong)g & 0xfffffffffffffffe),support);
      ddClearFlag((DdNode *)((ulong)g & 0xfffffffffffffffe));
      pDVar4 = dd->one;
      *onlyG = pDVar4;
      *onlyF = pDVar4;
      *common = pDVar4;
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)(((ulong)*onlyF & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)(((ulong)*onlyG & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      if (0 < (int)uVar7) {
        do {
          uVar7 = uVar7 - 1;
          index = uVar7;
          if ((long)uVar6 <= (long)dd->size) {
            index = dd->invperm[uVar6 - 1];
          }
          if ((piVar3[(int)index] != 0) || (support[(int)index] != 0)) {
            pDVar4 = cuddUniqueInter(dd,index,dd->one,(DdNode *)((ulong)dd->one ^ 1));
            piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            if (support[(int)index] == 0) {
              pDVar5 = Cudd_bddAnd(dd,*onlyF,pDVar4);
              ppDVar8 = onlyF;
              if (pDVar5 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,*common);
                pDVar5 = *onlyF;
LAB_00809de1:
                Cudd_RecursiveDeref(dd,pDVar5);
                pDVar5 = *onlyG;
LAB_00809e16:
                Cudd_RecursiveDeref(dd,pDVar5);
                Cudd_RecursiveDeref(dd,pDVar4);
                free(piVar3);
                piVar3 = support;
                goto LAB_00809e38;
              }
            }
            else if (piVar3[(int)index] == 0) {
              pDVar5 = Cudd_bddAnd(dd,*onlyG,pDVar4);
              ppDVar8 = onlyG;
              if (pDVar5 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                pDVar5 = *onlyG;
                goto LAB_00809e16;
              }
            }
            else {
              pDVar5 = Cudd_bddAnd(dd,*common,pDVar4);
              ppDVar8 = common;
              if (pDVar5 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,*common);
                pDVar5 = *onlyF;
                goto LAB_00809de1;
              }
            }
            piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,*ppDVar8);
            *ppDVar8 = pDVar5;
            Cudd_RecursiveDeref(dd,pDVar4);
          }
          bVar2 = 1 < (long)uVar6;
          uVar6 = uVar6 - 1;
        } while (bVar2);
      }
      free(piVar3);
      free(support);
      piVar3 = (int *)(((ulong)*common & 0xfffffffffffffffe) + 4);
      *piVar3 = *piVar3 + -1;
      piVar3 = (int *)(((ulong)*onlyF & 0xfffffffffffffffe) + 4);
      *piVar3 = *piVar3 + -1;
      piVar3 = (int *)(((ulong)*onlyG & 0xfffffffffffffffe) + 4);
      *piVar3 = *piVar3 + -1;
      return 1;
    }
    dd->errorCode = CUDD_MEMORY_OUT;
LAB_00809e38:
    free(piVar3);
  }
  return 0;
}

Assistant:

int
Cudd_ClassifySupport(
  DdManager * dd /* manager */,
  DdNode * f /* first DD */,
  DdNode * g /* second DD */,
  DdNode ** common /* cube of shared variables */,
  DdNode ** onlyF /* cube of variables only in f */,
  DdNode ** onlyG /* cube of variables only in g */)
{
    int *supportF, *supportG;
    DdNode *tmp, *var;
    int i,j;
    int size;

    /* Allocate and initialize support arrays for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    supportF = ABC_ALLOC(int,size);
    if (supportF == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    supportG = ABC_ALLOC(int,size);
    if (supportG == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(supportF);
        return(0);
    }
    for (i = 0; i < size; i++) {
        supportF[i] = 0;
        supportG[i] = 0;
    }

    /* Compute supports and clean up markers. */
    ddSupportStep(Cudd_Regular(f),supportF);
    ddClearFlag(Cudd_Regular(f));
    ddSupportStep(Cudd_Regular(g),supportG);
    ddClearFlag(Cudd_Regular(g));

    /* Classify variables and create cubes. */
    *common = *onlyF = *onlyG = DD_ONE(dd);
    cuddRef(*common); cuddRef(*onlyF); cuddRef(*onlyG);
    for (j = size - 1; j >= 0; j--) { /* for each level bottom-up */
        i = (j >= dd->size) ? j : dd->invperm[j];
        if (supportF[i] == 0 && supportG[i] == 0) continue;
        var = cuddUniqueInter(dd,i,dd->one,Cudd_Not(dd->one));
        cuddRef(var);
        if (supportG[i] == 0) {
            tmp = Cudd_bddAnd(dd,*onlyF,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                Cudd_RecursiveDeref(dd,*onlyG);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(supportF); ABC_FREE(supportG);
                return(0);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,*onlyF);
            *onlyF = tmp;
        } else if (supportF[i] == 0) {
            tmp = Cudd_bddAnd(dd,*onlyG,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                Cudd_RecursiveDeref(dd,*onlyG);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(supportF); ABC_FREE(supportG);
                return(0);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,*onlyG);
            *onlyG = tmp;
        } else {
            tmp = Cudd_bddAnd(dd,*common,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                Cudd_RecursiveDeref(dd,*onlyG);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(supportF); ABC_FREE(supportG);
                return(0);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,*common);
            *common = tmp;
        }
        Cudd_RecursiveDeref(dd,var);
    }

    ABC_FREE(supportF); ABC_FREE(supportG);
    cuddDeref(*common); cuddDeref(*onlyF); cuddDeref(*onlyG);
    return(1);

}